

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void target_finish(gen_ctx_t gen_ctx)

{
  gen_ctx_t gen_ctx_local;
  
  patterns_finish(gen_ctx);
  _MIR_free_insn(gen_ctx->ctx,gen_ctx->target_ctx->temp_jump);
  VARR_uint8_tdestroy(&gen_ctx->target_ctx->result_code);
  VARR_intdestroy(&gen_ctx->target_ctx->insn_pattern_indexes);
  VARR_uint64_tdestroy(&gen_ctx->target_ctx->const_pool);
  VARR_const_ref_tdestroy(&gen_ctx->target_ctx->const_refs);
  VARR_label_ref_tdestroy(&gen_ctx->target_ctx->label_refs);
  VARR_uint64_tdestroy(&gen_ctx->target_ctx->abs_address_locs);
  VARR_MIR_code_reloc_tdestroy(&gen_ctx->target_ctx->relocs);
  VARR_call_ref_tdestroy(&gen_ctx->target_ctx->call_refs);
  free(gen_ctx->target_ctx);
  gen_ctx->target_ctx = (target_ctx *)0x0;
  return;
}

Assistant:

static void target_finish (gen_ctx_t gen_ctx) {
  patterns_finish (gen_ctx);
  _MIR_free_insn (gen_ctx->ctx, temp_jump);
  VARR_DESTROY (uint8_t, result_code);
  VARR_DESTROY (int, insn_pattern_indexes);
  VARR_DESTROY (uint64_t, const_pool);
  VARR_DESTROY (const_ref_t, const_refs);
  VARR_DESTROY (label_ref_t, label_refs);
  VARR_DESTROY (uint64_t, abs_address_locs);
  VARR_DESTROY (MIR_code_reloc_t, relocs);
  VARR_DESTROY (call_ref_t, gen_ctx->target_ctx->call_refs);
  free (gen_ctx->target_ctx);
  gen_ctx->target_ctx = NULL;
}